

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

void idx2::Init(brick_pool *Bp,idx2_file *Idx2)

{
  u64 uVar1;
  allocator *AllocIn;
  undefined4 in_R8D;
  v3i Brick3;
  i64 NFinestBricks;
  idx2_file *Idx2_local;
  brick_pool *Bp_local;
  undefined1 local_38 [12];
  undefined4 local_2c;
  stack_array<idx2::v3<int>,_16> *local_28;
  uint local_1c;
  int local_18;
  int local_14;
  undefined1 *local_10;
  
  Bp->Idx2 = Idx2;
  local_28 = &Idx2->NBricks3;
  local_2c = 0;
  local_14 = local_28->Arr[0].field_0.field_0.X + -1;
  local_18 = (Idx2->NBricks3).Arr[0].field_0.field_0.Y + -1;
  local_1c = (Idx2->NBricks3).Arr[0].field_0.field_0.Z - 1;
  local_10 = local_38;
  Brick3.field_0.field_0.Y = 0;
  Brick3.field_0.field_0.X = local_1c;
  Brick3.field_0.field_0.Z = in_R8D;
  uVar1 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)0x0,local_14,Brick3);
  AllocIn = &Mallocator()->super_allocator;
  Init<unsigned_long,idx2::brick_volume>(&Bp->BrickTable,10,AllocIn);
  Resize<signed_char>(&Bp->ResolutionLevels,uVar1 + 1);
  return;
}

Assistant:

void
Init(brick_pool* Bp, const idx2_file* Idx2)
{
  Bp->Idx2 = Idx2;
  i64 NFinestBricks = 1 + GetLinearBrick(*Idx2, 0, Idx2->NBricks3[0] - 1);
  Init(&Bp->BrickTable, 10);
  Resize(&Bp->ResolutionLevels, NFinestBricks);
}